

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

opj_thread_t * opj_thread_create(opj_thread_fn thread_fn,void *user_data)

{
  int iVar1;
  opj_thread_t *__arg;
  pthread_attr_t attr;
  
  if (thread_fn == (opj_thread_fn)0x0) {
    __assert_fail("thread_fn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/thread.c"
                  ,0x191,"opj_thread_t *opj_thread_create(opj_thread_fn, void *)");
  }
  __arg = (opj_thread_t *)opj_malloc(0x18);
  if (__arg != (opj_thread_t *)0x0) {
    __arg->thread_fn = thread_fn;
    __arg->user_data = user_data;
    pthread_attr_init((pthread_attr_t *)&attr);
    pthread_attr_setdetachstate((pthread_attr_t *)&attr,0);
    iVar1 = pthread_create(&__arg->thread,(pthread_attr_t *)&attr,opj_thread_callback_adapter,__arg)
    ;
    if (iVar1 == 0) {
      return __arg;
    }
    opj_free(__arg);
  }
  return (opj_thread_t *)0x0;
}

Assistant:

opj_thread_t* opj_thread_create(opj_thread_fn thread_fn, void* user_data)
{
    pthread_attr_t attr;
    opj_thread_t* thread;

    assert(thread_fn);

    thread = (opj_thread_t*) opj_malloc(sizeof(opj_thread_t));
    if (!thread) {
        return NULL;
    }
    thread->thread_fn = thread_fn;
    thread->user_data = user_data;

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);
    if (pthread_create(&(thread->thread), &attr,
                       opj_thread_callback_adapter, (void *) thread) != 0) {
        opj_free(thread);
        return NULL;
    }
    return thread;
}